

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O2

void CreateNewEntry<Assimp::LWO::WeightChannel>(WeightChannel *chan,uint srcIdx)

{
  vector<bool,_std::allocator<bool>_> *this;
  vector<float,_std::allocator<float>_> *this_00;
  uint uVar1;
  uint a;
  uint uVar2;
  reference rVar3;
  
  if ((chan->super_VMapEntry).name._M_string_length != 0) {
    this = &(chan->super_VMapEntry).abAssigned;
    rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[](this,(ulong)srcIdx);
    *rVar3._M_p = *rVar3._M_p | rVar3._M_mask;
    std::vector<bool,_std::allocator<bool>_>::resize
              (this,(ulong)*(uint *)((long)&(chan->super_VMapEntry).abAssigned.
                                            super__Bvector_base<std::allocator<bool>_>._M_impl.
                                            super__Bvector_impl_data._M_finish.
                                            super__Bit_iterator_base + 8) +
                    ((long)(chan->super_VMapEntry).abAssigned.
                           super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                    (long)(chan->super_VMapEntry).abAssigned.
                          super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 + 1,
               false);
    this_00 = &(chan->super_VMapEntry).rawData;
    for (uVar2 = 0; uVar1 = (chan->super_VMapEntry).dims, uVar2 < uVar1; uVar2 = uVar2 + 1) {
      std::vector<float,_std::allocator<float>_>::push_back
                (this_00,(this_00->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                         super__Vector_impl_data._M_start + (uVar1 * srcIdx + uVar2));
    }
  }
  return;
}

Assistant:

inline void CreateNewEntry(T& chan, unsigned int srcIdx)
{
    if (!chan.name.length())
        return;

    chan.abAssigned[srcIdx] = true;
    chan.abAssigned.resize(chan.abAssigned.size()+1,false);

    for (unsigned int a = 0; a < chan.dims;++a)
        chan.rawData.push_back(chan.rawData[srcIdx*chan.dims+a]);
}